

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateMembers
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Printer *printer_local;
  ImmutableEnumFieldLiteGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"private int $name$_;\n");
  PrintExtraFieldInfo(&this->variables_,printer);
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_message$;\n}\n"
                      );
  }
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "$deprecation$public int get$capitalized_name$Value() {\n  return $name$_;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  $type$ result = $type$.forNumber($name$_);\n  return result == null ? $unknown$ : result;\n}\n"
                    );
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,
                       "private void set$capitalized_name$Value(int value) {\n  $set_has_field_bit_message$  $name$_ = value;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  $set_has_field_bit_message$\n  $name$_ = value.getNumber();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,
                     "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n  $name$_ = $default_number$;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private int $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_message$;\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  return $name$_;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  $type$ result = $type$.forNumber($name$_);\n"
    "  return result == null ? $unknown$ : result;\n"
    "}\n");

  // Generate private setters for the builder to proxy into.
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void set$capitalized_name$Value(int value) {\n"
      "  $set_has_field_bit_message$"
      "  $name$_ = value;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  $set_has_field_bit_message$\n"
    "  $name$_ = value.getNumber();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $clear_has_field_bit_message$\n"
    "  $name$_ = $default_number$;\n"
    "}\n");
}